

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::BW_OP(SQVM *this,SQUnsignedInteger op,SQObjectPtr *trg,SQObjectPtr *o1,SQObjectPtr *o2)

{
  SQChar *pSVar1;
  SQChar *pSVar2;
  uint *in_RCX;
  undefined8 in_RSI;
  SQVM *in_RDI;
  uint *in_R8;
  SQInteger i2;
  SQInteger i1;
  SQInteger res;
  SQInteger in_stack_ffffffffffffff98;
  SQObjectPtr *in_stack_ffffffffffffffa0;
  bool local_1;
  
  if ((*in_RCX | *in_R8) == 0x5000002) {
    switch(in_RSI) {
    case 0:
      break;
    default:
      Raise_Error(in_RDI,"internal vm error bitwise op failed");
      return false;
    case 2:
      break;
    case 3:
      break;
    case 4:
      break;
    case 5:
      break;
    case 6:
    }
    ::SQObjectPtr::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_1 = true;
  }
  else {
    pSVar1 = GetTypeName((SQObjectPtr *)0x1409da);
    pSVar2 = GetTypeName((SQObjectPtr *)0x1409e9);
    Raise_Error(in_RDI,"bitwise op between \'%s\' and \'%s\'",pSVar1,pSVar2);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SQVM::BW_OP(SQUnsignedInteger op,SQObjectPtr &trg,const SQObjectPtr &o1,const SQObjectPtr &o2)
{
    SQInteger res;
    if((type(o1)|type(o2)) == OT_INTEGER)
    {
        SQInteger i1 = _integer(o1), i2 = _integer(o2);
        switch(op) {
            case BW_AND:    res = i1 & i2; break;
            case BW_OR:     res = i1 | i2; break;
            case BW_XOR:    res = i1 ^ i2; break;
            case BW_SHIFTL: res = i1 << i2; break;
            case BW_SHIFTR: res = i1 >> i2; break;
            case BW_USHIFTR:res = (SQInteger)(*((SQUnsignedInteger*)&i1) >> i2); break;
            default: { Raise_Error(_SC("internal vm error bitwise op failed")); return false; }
        }
    }
    else { Raise_Error(_SC("bitwise op between '%s' and '%s'"),GetTypeName(o1),GetTypeName(o2)); return false;}
    trg = res;
    return true;
}